

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cpp
# Opt level: O0

string * pbrt::detail::copyToFormatString(char **fmt_ptr,string *s)

{
  char cVar1;
  string *in_RDX;
  long *in_RSI;
  string *in_RDI;
  char c;
  char **fmt;
  string *nextFmt;
  
  while (*(char *)*in_RSI != '\0') {
    if (*(char *)*in_RSI == '%') {
      if (*(char *)(*in_RSI + 1) != '%') break;
      std::__cxx11::string::operator+=(in_RDX,'%');
      std::__cxx11::string::operator+=(in_RDX,'%');
      *in_RSI = *in_RSI + 2;
    }
    else {
      std::__cxx11::string::operator+=(in_RDX,*(char *)*in_RSI);
      *in_RSI = *in_RSI + 1;
    }
  }
  std::__cxx11::string::string((string *)in_RDI);
  while( true ) {
    if (*(char *)*in_RSI == '\0') {
      return in_RDI;
    }
    cVar1 = *(char *)*in_RSI;
    std::__cxx11::string::operator+=((string *)in_RDI,cVar1);
    *in_RSI = *in_RSI + 1;
    if (cVar1 == 'd') {
      return in_RDI;
    }
    if (cVar1 == 'i') {
      return in_RDI;
    }
    if (cVar1 == 'o') {
      return in_RDI;
    }
    if (cVar1 == 'u') {
      return in_RDI;
    }
    if (cVar1 == 'x') {
      return in_RDI;
    }
    if (cVar1 == 'e') {
      return in_RDI;
    }
    if (cVar1 == 'E') {
      return in_RDI;
    }
    if (cVar1 == 'f') {
      return in_RDI;
    }
    if (cVar1 == 'F') {
      return in_RDI;
    }
    if (cVar1 == 'g') {
      return in_RDI;
    }
    if (cVar1 == 'G') {
      return in_RDI;
    }
    if (cVar1 == 'a') {
      return in_RDI;
    }
    if (cVar1 == 'A') {
      return in_RDI;
    }
    if (cVar1 == 'c') {
      return in_RDI;
    }
    if (cVar1 == 'C') break;
    if (cVar1 == 's') {
      return in_RDI;
    }
    if (cVar1 == 'S') {
      return in_RDI;
    }
    if (cVar1 == 'p') {
      return in_RDI;
    }
  }
  return in_RDI;
}

Assistant:

std::string copyToFormatString(const char **fmt_ptr, std::string *s) {
    const char *&fmt = *fmt_ptr;
    while (*fmt) {
        if (*fmt != '%') {
            *s += *fmt;
            ++fmt;
        } else if (fmt[1] == '%') {
            // "%%"; let it pass through
            *s += '%';
            *s += '%';
            fmt += 2;
        } else
            // fmt is at the start of a formatting directive.
            break;
    }

    std::string nextFmt;
    while (*fmt) {
        char c = *fmt;
        nextFmt += c;
        ++fmt;
        // Is it a conversion specifier?
        if (c == 'd' || c == 'i' || c == 'o' || c == 'u' || c == 'x' || c == 'e' ||
            c == 'E' || c == 'f' || c == 'F' || c == 'g' || c == 'G' || c == 'a' ||
            c == 'A' || c == 'c' || c == 'C' || c == 's' || c == 'S' || c == 'p')
            break;
    }

    return nextFmt;
}